

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::relaxedFmsF32x4
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *this_00;
  undefined1 local_1c0 [8];
  LaneArray<4> x;
  LaneArray<4> y;
  LaneArray<4> z;
  undefined1 auStack_88 [8];
  LaneArray<4> r;
  
  getLanesF32x4((LaneArray<4> *)local_1c0,this);
  getLanesF32x4((LaneArray<4> *)&x._M_elems[3].type,left);
  getLanesF32x4((LaneArray<4> *)&y._M_elems[3].type,right);
  r._M_elems[3].field_0.i64 = 0;
  r._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[2].type.id = 0;
  r._M_elems[1].type.id = 0;
  r._M_elems[2].field_0.i64 = 0;
  r._M_elems[1].field_0.i64 = 0;
  r._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].type.id = 0;
  auStack_88 = (undefined1  [8])0x0;
  r._M_elems[0].field_0.i64 = 0;
  lVar1 = 0;
  __return_storage_ptr___00 = &z._M_elems[3].type;
  do {
    fms((Literal *)__return_storage_ptr___00,(Literal *)(local_1c0 + lVar1),
        (Literal *)((long)&x._M_elems[3].type.id + lVar1),
        (Literal *)((long)&y._M_elems[3].type.id + lVar1));
    this_00 = (Literal *)((long)r._M_elems + lVar1 + -8);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)auStack_88);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)r._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)&y._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)&x._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)(local_1c0 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedFmsF32x4(const Literal& left,
                                 const Literal& right) const {
  return ternary<4, &Literal::getLanesF32x4, &Literal::fms>(*this, left, right);
}